

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac_seek_to_pcm_frame(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  ma_dr_flac_frame *header;
  ma_uint64 *pFirstPCMFrame;
  ma_dr_flac_bs *bs;
  ushort uVar1;
  ulong pcmFrameIndex_00;
  ma_dr_flac_oggbs *oggbs;
  ma_dr_flac_seekpoint *pmVar2;
  bool bVar3;
  bool bVar4;
  ma_uint64 *pmVar5;
  ma_bool32 mVar6;
  ma_result mVar7;
  ma_bool32 mVar8;
  ma_uint64 mVar9;
  ma_uint64 mVar10;
  ma_uint32 mVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ma_dr_flac_seekpoint *pmVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  ulong local_40;
  
  pFirstPCMFrame = &pFlac->currentPCMFrame;
  bs = &pFlac->bs;
  header = &pFlac->currentFLACFrame;
  bVar3 = false;
  do {
    bVar4 = bVar3;
    if (pFlac == (ma_dr_flac *)0x0) goto LAB_0014d87c;
    pcmFrameIndex_00 = *pFirstPCMFrame;
    if (pcmFrameIndex_00 == pcmFrameIndex) {
      mVar6 = 1;
      break;
    }
    mVar9 = pFlac->firstFLACFramePosInBytes;
    if (mVar9 == 0) {
      mVar6 = 0;
      break;
    }
    if (pcmFrameIndex == 0) {
      pFlac->currentPCMFrame = 0;
      mVar6 = ma_dr_flac__seek_to_first_frame(pFlac);
      if (!bVar4) {
        return mVar6;
      }
      goto LAB_0014d87c;
    }
    uVar20 = pFlac->totalPCMFrameCount;
    if (uVar20 < pcmFrameIndex) {
      pcmFrameIndex = uVar20;
    }
    if (pcmFrameIndex <= pcmFrameIndex_00) {
      uVar15 = (int)pcmFrameIndex_00 - (int)pcmFrameIndex;
      mVar11 = (pFlac->currentFLACFrame).pcmFramesRemaining;
      if ((pFlac->currentFLACFrame).header.blockSizeInPCMFrames - mVar11 <= uVar15)
      goto LAB_0014d1ae;
      (pFlac->currentFLACFrame).pcmFramesRemaining = mVar11 + uVar15;
LAB_0014d86f:
      pFlac->currentPCMFrame = pcmFrameIndex;
joined_r0x0014d87a:
      if (!bVar4) {
        return 1;
      }
      goto LAB_0014d87c;
    }
    uVar13 = (int)pcmFrameIndex - (int)pcmFrameIndex_00;
    uVar15 = (pFlac->currentFLACFrame).pcmFramesRemaining;
    mVar11 = uVar15 - uVar13;
    if (uVar13 <= uVar15 && mVar11 != 0) {
      (pFlac->currentFLACFrame).pcmFramesRemaining = mVar11;
      goto LAB_0014d86f;
    }
LAB_0014d1ae:
    if (pFlac->container == ma_dr_flac_container_ogg) {
      oggbs = (ma_dr_flac_oggbs *)pFlac->_oggbs;
      mVar10 = oggbs->currentBytePos;
      mVar6 = ma_dr_flac__seek_to_byte(bs,mVar9);
      if (mVar6 != 0) {
        oggbs->bytesRemainingInPage = 0;
        local_40 = 0;
        while (mVar6 = ma_dr_flac_oggbs__goto_next_page
                                 (oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch), mVar6 != 0) {
          uVar20 = (oggbs->currentPageHeader).granulePosition;
          if (pcmFrameIndex <= uVar20) {
            mVar6 = ma_dr_flac_oggbs__seek_physical
                              (oggbs,(oggbs->currentBytePos -
                                     ((ulong)oggbs->pageDataSize +
                                     (ulong)(oggbs->currentPageHeader).segmentCount)) - 0x1b,
                               ma_dr_flac_seek_origin_start);
            if ((mVar6 != 0) &&
               (mVar6 = ma_dr_flac_oggbs__goto_next_page
                                  (oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch), mVar6 != 0)) {
              do {
                do {
                  while( true ) {
                    mVar6 = ma_dr_flac__read_next_flac_frame_header
                                      (bs,pFlac->bitsPerSample,&header->header);
                    if (mVar6 == 0) goto LAB_0014d7cd;
                    mVar9 = (header->header).pcmFrameNumber;
                    if (mVar9 == 0) {
                      mVar9 = (ulong)pFlac->maxBlockSizeInPCMFrames *
                              (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
                    }
                    lVar12 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar9;
                    lVar14 = 0;
                    if (lVar12 != 0) {
                      lVar14 = lVar12 + -1;
                    }
                    uVar20 = ((local_40 + 1) - mVar9) + lVar14;
                    if ((pFlac->totalPCMFrameCount == pcmFrameIndex) &&
                       (uVar20 == pFlac->totalPCMFrameCount)) {
                      mVar7 = ma_dr_flac__decode_flac_frame(pFlac);
                      if (mVar7 != MA_SUCCESS) goto LAB_0014d7cd;
                      (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
                      goto LAB_0014d892;
                    }
                    if (uVar20 <= pcmFrameIndex) break;
                    mVar7 = ma_dr_flac__decode_flac_frame(pFlac);
                    if (mVar7 != MA_CRC_MISMATCH) {
                      if (mVar7 != MA_SUCCESS) goto LAB_0014d7cd;
                      mVar9 = pcmFrameIndex - local_40;
                      if (mVar9 == 0) goto LAB_0014d892;
                      pFlac->currentPCMFrame = local_40;
                      goto LAB_0014d7b9;
                    }
                  }
                  mVar7 = ma_dr_flac__seek_flac_frame(pFlac);
                } while (mVar7 == MA_CRC_MISMATCH);
                local_40 = uVar20;
              } while (mVar7 == MA_SUCCESS);
            }
            goto LAB_0014d7cd;
          }
          if ((((((oggbs->currentPageHeader).headerType & 1) == 0) &&
               (1 < (oggbs->currentPageHeader).segmentTable[0])) && (oggbs->pageData[0] == 0xff)) &&
             ((oggbs->pageData[1] & 0xfc) == 0xf8)) {
            local_40 = uVar20;
          }
        }
        ma_dr_flac_oggbs__seek_physical(oggbs,mVar10,ma_dr_flac_seek_origin_start);
      }
    }
    else {
      if (((pFlac->field_0x128 & 1) == 0) &&
         (pmVar2 = pFlac->pSeekpoints, pmVar2 != (ma_dr_flac_seekpoint *)0x0)) {
        uVar15 = pFlac->seekpointCount;
        if (((ulong)uVar15 == 0) || (pcmFrameIndex < pmVar2->firstPCMFrame)) goto LAB_0014d5ec;
        uVar17 = 0;
        pmVar16 = pmVar2;
        uVar19 = 0;
        do {
          uVar18 = uVar19;
          if (uVar15 == uVar17) break;
          uVar19 = uVar17 & 0xffffffff;
          uVar17 = uVar17 + 1;
          pmVar5 = &pmVar16->firstPCMFrame;
          pmVar16 = pmVar16 + 1;
        } while (*pmVar5 < pcmFrameIndex);
        if (((pmVar2[uVar18].pcmFrameCount == 0) ||
            (pFlac->maxBlockSizeInPCMFrames < pmVar2[uVar18].pcmFrameCount)) ||
           ((uVar20 != 0 && (uVar20 < pmVar2[uVar18].firstPCMFrame)))) goto LAB_0014d5ec;
        if (uVar20 == 0) {
LAB_0014d3b3:
          uVar20 = pFlac->currentPCMFrame;
          uVar19 = pFlac->pSeekpoints[uVar18].firstPCMFrame;
          if ((pcmFrameIndex < uVar20) || (uVar20 < uVar19)) {
            mVar6 = ma_dr_flac__seek_to_byte
                              (bs,pFlac->pSeekpoints[uVar18].flacFrameOffset +
                                  pFlac->firstFLACFramePosInBytes);
            uVar20 = uVar19;
            if (mVar6 != 0) goto LAB_0014d563;
          }
          else {
            if (uVar20 == 0) {
              if ((pFlac->currentFLACFrame).pcmFramesRemaining == 0) {
                mVar6 = ma_dr_flac__read_next_flac_frame_header
                                  (bs,pFlac->bitsPerSample,&header->header);
                if (mVar6 == 0) goto LAB_0014d5ec;
                bVar3 = true;
                uVar20 = 0;
              }
              else {
                uVar20 = 0;
                bVar3 = false;
              }
            }
            else {
              bVar3 = false;
            }
            do {
              mVar9 = (header->header).pcmFrameNumber;
              if (mVar9 == 0) {
                mVar9 = (ulong)pFlac->maxBlockSizeInPCMFrames *
                        (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
              }
              lVar12 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar9;
              lVar14 = 0;
              if (lVar12 != 0) {
                lVar14 = lVar12 + -1;
              }
              uVar19 = (uVar20 - mVar9) + lVar14 + 1;
              if (pcmFrameIndex < uVar19) {
                if (bVar3) {
                  mVar7 = ma_dr_flac__decode_flac_frame(pFlac);
                  if (mVar7 == MA_CRC_MISMATCH) goto LAB_0014d563;
                  if (mVar7 != MA_SUCCESS) break;
                }
                mVar9 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,pcmFrameIndex - uVar20);
                if (mVar9 == pcmFrameIndex - uVar20) goto LAB_0014d892;
                break;
              }
              if (bVar3) {
                mVar7 = ma_dr_flac__seek_flac_frame(pFlac);
                if (mVar7 != MA_CRC_MISMATCH) {
                  if (mVar7 == MA_SUCCESS) goto LAB_0014d815;
                  break;
                }
              }
              else {
                uVar19 = uVar20 + (pFlac->currentFLACFrame).pcmFramesRemaining;
                (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
LAB_0014d815:
                uVar20 = uVar19;
                if ((pFlac->totalPCMFrameCount == pcmFrameIndex) &&
                   (uVar19 == pFlac->totalPCMFrameCount)) goto LAB_0014d892;
              }
LAB_0014d563:
              mVar6 = ma_dr_flac__read_next_flac_frame_header
                                (bs,pFlac->bitsPerSample,&header->header);
              bVar3 = true;
            } while (mVar6 != 0);
          }
          goto LAB_0014d5ec;
        }
        fVar21 = (float)(long)((ulong)pFlac->bitsPerSample * uVar20 * pFlac->channels) * 0.125;
        uVar20 = (ulong)fVar21;
        mVar10 = ((long)(fVar21 - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20) + mVar9;
        if ((uint)uVar18 < uVar15 - 1) {
          uVar15 = (uint)uVar18 + 1;
          if ((pmVar2[uVar15].flacFrameOffset <= pmVar2[uVar18].flacFrameOffset) ||
             (pmVar2[uVar15].pcmFrameCount == 0)) goto LAB_0014d5ec;
          if (pmVar2[uVar15].firstPCMFrame != 0xffffffffffffffff) {
            mVar10 = (mVar9 - 1) + pmVar2[uVar15].flacFrameOffset;
          }
        }
        mVar9 = pmVar2[uVar18].flacFrameOffset + mVar9;
        mVar6 = ma_dr_flac__seek_to_byte(bs,mVar9);
        if ((mVar6 == 0) ||
           (mVar6 = ma_dr_flac__read_next_flac_frame_header(bs,pFlac->bitsPerSample,&header->header)
           , mVar6 == 0)) goto LAB_0014d3b3;
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac,pFirstPCMFrame,(ma_uint64 *)0x0)
        ;
        mVar6 = ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                          (pFlac,pcmFrameIndex,mVar9,mVar10);
        if (mVar6 == 0) goto LAB_0014d3b3;
LAB_0014d892:
        *pFirstPCMFrame = pcmFrameIndex;
        goto joined_r0x0014d87a;
      }
LAB_0014d5ec:
      if (((pFlac->field_0x128 & 2) == 0) && (pFlac->totalPCMFrameCount != 0)) {
        uVar1 = pFlac->maxBlockSizeInPCMFrames;
        mVar6 = ma_dr_flac__seek_to_first_frame(pFlac);
        if (mVar6 != 0) {
          uVar20 = (ulong)((uint)uVar1 + (uint)uVar1);
          if (uVar1 == 0) {
            uVar20 = 0x1000;
          }
          if (pcmFrameIndex < uVar20) {
            mVar9 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,pcmFrameIndex);
            uVar15 = (uint)(mVar9 == pcmFrameIndex);
          }
          else {
            fVar21 = (float)(long)((ulong)pFlac->bitsPerSample *
                                  (ulong)pFlac->channels * pFlac->totalPCMFrameCount) * 0.125;
            uVar20 = (ulong)fVar21;
            uVar15 = ma_dr_flac__seek_to_pcm_frame__binary_search_internal
                               (pFlac,pcmFrameIndex,pFlac->firstFLACFramePosInBytes,
                                ((long)(fVar21 - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20) +
                                pFlac->firstFLACFramePosInBytes);
          }
          if (uVar15 != 0) goto LAB_0014d892;
        }
      }
      if ((pFlac->field_0x128 & 4) == 0) {
        uVar20 = *pFirstPCMFrame;
        if (pcmFrameIndex < uVar20) {
          mVar6 = ma_dr_flac__seek_to_first_frame(pFlac);
          if (mVar6 != 0) {
LAB_0014d6ce:
            mVar6 = ma_dr_flac__read_next_flac_frame_header(bs,pFlac->bitsPerSample,&header->header)
            ;
            if (mVar6 != 0) {
              bVar3 = true;
              uVar20 = 0;
              goto LAB_0014d700;
            }
          }
        }
        else {
          if (uVar20 == 0) {
            if ((pFlac->currentFLACFrame).pcmFramesRemaining == 0) goto LAB_0014d6ce;
            uVar20 = 0;
          }
          bVar3 = false;
LAB_0014d700:
          do {
            mVar9 = (header->header).pcmFrameNumber;
            if (mVar9 == 0) {
              mVar9 = (ulong)pFlac->maxBlockSizeInPCMFrames *
                      (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
            }
            lVar12 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar9;
            lVar14 = 0;
            if (lVar12 != 0) {
              lVar14 = lVar12 + -1;
            }
            uVar19 = (uVar20 - mVar9) + lVar14 + 1;
            if (pcmFrameIndex < uVar19) {
              if (bVar3) {
                mVar7 = ma_dr_flac__decode_flac_frame(pFlac);
                if (mVar7 == MA_CRC_MISMATCH) goto LAB_0014d791;
                if (mVar7 != MA_SUCCESS) break;
              }
              mVar9 = pcmFrameIndex - uVar20;
LAB_0014d7b9:
              mVar10 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,mVar9);
              if (mVar10 == mVar9) goto LAB_0014d892;
              break;
            }
            if (bVar3) {
              mVar7 = ma_dr_flac__seek_flac_frame(pFlac);
              if (mVar7 == MA_CRC_MISMATCH) goto LAB_0014d791;
              if (mVar7 == MA_SUCCESS) goto LAB_0014d778;
              break;
            }
            uVar19 = uVar20 + (pFlac->currentFLACFrame).pcmFramesRemaining;
            (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
LAB_0014d778:
            uVar20 = uVar19;
            if ((pFlac->totalPCMFrameCount == pcmFrameIndex) &&
               (uVar19 == pFlac->totalPCMFrameCount)) goto LAB_0014d892;
LAB_0014d791:
            mVar6 = ma_dr_flac__read_next_flac_frame_header(bs,pFlac->bitsPerSample,&header->header)
            ;
            bVar3 = true;
          } while (mVar6 != 0);
        }
      }
    }
LAB_0014d7cd:
    mVar8 = ma_dr_flac_seek_to_pcm_frame(pFlac,pcmFrameIndex_00);
    pcmFrameIndex = 0;
    mVar6 = 0;
    bVar3 = true;
  } while (mVar8 == 0);
  if (bVar4) {
LAB_0014d87c:
    mVar6 = 0;
  }
  return mVar6;
}

Assistant:

MA_API ma_bool32 ma_dr_flac_seek_to_pcm_frame(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    if (pFlac == NULL) {
        return MA_FALSE;
    }
    if (pFlac->currentPCMFrame == pcmFrameIndex) {
        return MA_TRUE;
    }
    if (pFlac->firstFLACFramePosInBytes == 0) {
        return MA_FALSE;
    }
    if (pcmFrameIndex == 0) {
        pFlac->currentPCMFrame = 0;
        return ma_dr_flac__seek_to_first_frame(pFlac);
    } else {
        ma_bool32 wasSuccessful = MA_FALSE;
        ma_uint64 originalPCMFrame = pFlac->currentPCMFrame;
        if (pcmFrameIndex > pFlac->totalPCMFrameCount) {
            pcmFrameIndex = pFlac->totalPCMFrameCount;
        }
        if (pcmFrameIndex > pFlac->currentPCMFrame) {
            ma_uint32 offset = (ma_uint32)(pcmFrameIndex - pFlac->currentPCMFrame);
            if (pFlac->currentFLACFrame.pcmFramesRemaining >  offset) {
                pFlac->currentFLACFrame.pcmFramesRemaining -= offset;
                pFlac->currentPCMFrame = pcmFrameIndex;
                return MA_TRUE;
            }
        } else {
            ma_uint32 offsetAbs = (ma_uint32)(pFlac->currentPCMFrame - pcmFrameIndex);
            ma_uint32 currentFLACFramePCMFrameCount = pFlac->currentFLACFrame.header.blockSizeInPCMFrames;
            ma_uint32 currentFLACFramePCMFramesConsumed = currentFLACFramePCMFrameCount - pFlac->currentFLACFrame.pcmFramesRemaining;
            if (currentFLACFramePCMFramesConsumed > offsetAbs) {
                pFlac->currentFLACFrame.pcmFramesRemaining += offsetAbs;
                pFlac->currentPCMFrame = pcmFrameIndex;
                return MA_TRUE;
            }
        }
#ifndef MA_DR_FLAC_NO_OGG
        if (pFlac->container == ma_dr_flac_container_ogg)
        {
            wasSuccessful = ma_dr_flac_ogg__seek_to_pcm_frame(pFlac, pcmFrameIndex);
        }
        else
#endif
        {
            if (!pFlac->_noSeekTableSeek) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__seek_table(pFlac, pcmFrameIndex);
            }
#if !defined(MA_DR_FLAC_NO_CRC)
            if (!wasSuccessful && !pFlac->_noBinarySearchSeek && pFlac->totalPCMFrameCount > 0) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__binary_search(pFlac, pcmFrameIndex);
            }
#endif
            if (!wasSuccessful && !pFlac->_noBruteForceSeek) {
                wasSuccessful = ma_dr_flac__seek_to_pcm_frame__brute_force(pFlac, pcmFrameIndex);
            }
        }
        if (wasSuccessful) {
            pFlac->currentPCMFrame = pcmFrameIndex;
        } else {
            if (ma_dr_flac_seek_to_pcm_frame(pFlac, originalPCMFrame) == MA_FALSE) {
                ma_dr_flac_seek_to_pcm_frame(pFlac, 0);
            }
        }
        return wasSuccessful;
    }
}